

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

void __thiscall bitfoot::Bitfoot::Evaluate(Bitfoot *this)

{
  Color CVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  int local_9c;
  bool local_82;
  int local_4c;
  bool blackCanWin;
  bool whiteCanWin;
  uint64_t blackPcs;
  uint64_t whitePcs;
  int count;
  uint64_t x;
  int eval;
  Bitfoot *this_local;
  
  if ((this->state & 0x20U) != 0) {
    __assert_fail("!(state & Draw)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0x6eb,"void bitfoot::Bitfoot::Evaluate()");
  }
  memset(&this->evals,0,0x50);
  memset(this->pinfo,0,0x70);
  memset(this->atks,0,0x70);
  this->atkCount[0] = 0;
  this->atkCount[1] = 0;
  this->atkScore[0] = 0;
  this->atkScore[1] = 0;
  CVar1 = ColorToMove(this);
  if (CVar1) {
    local_4c = -_tempo;
  }
  else {
    local_4c = _tempo;
  }
  iVar5 = this->material[0];
  iVar6 = this->material[1];
  iVar7 = this->sqrVal[0];
  iVar8 = this->sqrVal[1];
  iVar3 = GetPins<true>(this,6);
  iVar4 = GetPins<false>(this,6);
  iVar4 = (((((local_4c + iVar5) - iVar6) + iVar7) - iVar8) + iVar3) - iVar4;
  if (this->pc[2] == 0) {
    x._4_4_ = iVar4 + -0x32;
  }
  else {
    iVar5 = PawnEval<false>(this);
    x._4_4_ = iVar5 + iVar4;
  }
  if (this->pc[3] == 0) {
    x._4_4_ = x._4_4_ + 0x32;
  }
  else {
    iVar5 = PawnEval<true>(this);
    x._4_4_ = x._4_4_ - iVar5;
  }
  if (this->pc[4] != 0) {
    iVar5 = KnightEval<false>(this);
    x._4_4_ = iVar5 + x._4_4_;
  }
  if (this->pc[5] != 0) {
    iVar5 = KnightEval<true>(this);
    x._4_4_ = x._4_4_ - iVar5;
  }
  if (this->pc[6] != 0) {
    iVar5 = BishopEval<false>(this);
    x._4_4_ = iVar5 + x._4_4_;
  }
  if (this->pc[7] != 0) {
    iVar5 = BishopEval<true>(this);
    x._4_4_ = x._4_4_ - iVar5;
  }
  if (this->pc[8] != 0) {
    iVar5 = RookEval<false>(this);
    x._4_4_ = iVar5 + x._4_4_;
  }
  if (this->pc[9] != 0) {
    iVar5 = RookEval<true>(this);
    x._4_4_ = x._4_4_ - iVar5;
  }
  if (this->pc[10] != 0) {
    iVar5 = QueenEval<false>(this);
    x._4_4_ = iVar5 + x._4_4_;
  }
  if (this->pc[0xb] != 0) {
    iVar5 = QueenEval<true>(this);
    x._4_4_ = x._4_4_ - iVar5;
  }
  this->atks[0] = this->atks[2] | this->atks[4] | this->atks[6] | this->atks[8] | this->atks[10];
  this->atks[1] = this->atks[3] | this->atks[5] | this->atks[7] | this->atks[9] | this->atks[0xb];
  iVar5 = KingEval<false>(this);
  iVar6 = KingEval<true>(this);
  x._4_4_ = (iVar5 + x._4_4_) - iVar6;
  this->atks[0xc] = *(uint64_t *)(_KING_ATK + (long)this->king[0] * 8);
  this->atks[0xd] = *(uint64_t *)(_KING_ATK + (long)this->king[1] * 8);
  this->atks[0] =
       this->atks[2] | this->atks[4] | this->atks[6] | this->atks[8] | this->atks[10] |
       this->atks[0xc];
  this->atks[1] =
       this->atks[3] | this->atks[5] | this->atks[7] | this->atks[9] | this->atks[0xb] |
       this->atks[0xd];
  if (this->pinfo[0].passed != 0) {
    iVar5 = PasserEval<false>(this);
    x._4_4_ = iVar5 + x._4_4_;
  }
  if (this->pinfo[1].passed != 0) {
    iVar5 = PasserEval<true>(this);
    x._4_4_ = x._4_4_ - iVar5;
  }
  VerifyPosition(this);
  bVar2 = IsDraw(this);
  if (bVar2) {
    this->state = this->state | 0x20;
    CVar1 = ColorToMove(this);
    this->standPat = (&_drawScore)[CVar1];
    return;
  }
  uVar9 = this->atks[2] | this->atks[4] | this->atks[6] | this->atks[8] |
          this->atks[10] & (this->atks[0xc] | 0x3c3c3c3c0000 | this->atks[0xd]);
  iVar5 = BitCount(uVar9);
  iVar6 = BitCount(uVar9 & 0x1818000000);
  iVar7 = BitCount(uVar9 & (this->atks[0xc] | this->atks[0xd]));
  uVar9 = this->atks[3] | this->atks[5] | this->atks[7] | this->atks[9] |
          this->atks[0xb] & (this->atks[0xc] | 0x3c3c3c3c0000 | this->atks[0xd]);
  iVar8 = BitCount(uVar9);
  iVar3 = BitCount(uVar9 & 0x1818000000);
  iVar4 = BitCount(uVar9 & (this->atks[0xc] | this->atks[0xd]));
  x._4_4_ = (iVar5 + iVar6 + iVar7 + x._4_4_) - (iVar8 + iVar3 + iVar4);
  uVar9 = this->pc[2];
  uVar10 = MinorPieces<false>(this);
  uVar9 = (uVar9 | uVar10) & (this->atks[0] ^ 0xffffffffffffffff);
  if (uVar9 != 0) {
    iVar5 = BitCount(uVar9);
    x._4_4_ = x._4_4_ + iVar5 * -6;
  }
  uVar9 = this->pc[3];
  uVar10 = MinorPieces<true>(this);
  uVar9 = (uVar9 | uVar10) & (this->atks[1] ^ 0xffffffffffffffff);
  if (uVar9 != 0) {
    iVar5 = BitCount(uVar9);
    x._4_4_ = iVar5 * 6 + x._4_4_;
  }
  if ((this->pc[4] & this->pc[4] - 1) != 0) {
    iVar5 = BitCount(this->pc[4]);
    x._4_4_ = x._4_4_ + (iVar5 + -1) * -0x10;
  }
  if ((this->pc[5] & this->pc[5] - 1) != 0) {
    iVar5 = BitCount(this->pc[5]);
    x._4_4_ = (iVar5 + -1) * 0x10 + x._4_4_;
  }
  if ((this->pc[2] != 0) || (this->pc[3] != 0)) {
    iVar5 = this->pinfo[0].count;
    iVar6 = BitCount(this->pc[2]);
    if (iVar5 != iVar6) {
      __assert_fail("pinfo[White].count == BitCount(pc[WhitePawn])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x74a,"void bitfoot::Bitfoot::Evaluate()");
    }
    iVar5 = this->pinfo[1].count;
    iVar6 = BitCount(this->pc[3]);
    if (iVar5 != iVar6) {
      __assert_fail("pinfo[Black].count == BitCount(pc[BlackPawn])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x74b,"void bitfoot::Bitfoot::Evaluate()");
    }
    uVar9 = this->pinfo[0].behind & (this->atks[1] ^ 0xffffffffffffffff);
    iVar5 = BitCount(uVar9 >> 8 & uVar9);
    uVar9 = this->pinfo[1].behind & (this->atks[0] ^ 0xffffffffffffffff);
    iVar6 = BitCount(uVar9 >> 8 & uVar9);
    x._4_4_ = iVar5 * 2 + x._4_4_ + iVar6 * -2;
    iVar5 = ((this->pinfo[0].count + this->pinfo[1].count) * 4) / 3;
    if (0x15 < iVar5) {
      __assert_fail("count <= 21",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x757,"void bitfoot::Bitfoot::Evaluate()");
    }
    if (this->pc[4] != 0) {
      x._4_4_ = iVar5 + x._4_4_;
    }
    if (this->pc[5] != 0) {
      x._4_4_ = x._4_4_ - iVar5;
    }
    iVar5 = (iVar5 << 2) / 3;
    if (0x1c < iVar5) {
      __assert_fail("count <= 28",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x761,"void bitfoot::Bitfoot::Evaluate()");
    }
    if (this->pc[8] != 0) {
      x._4_4_ = (0x1c - iVar5) + x._4_4_;
    }
    if (this->pc[9] != 0) {
      x._4_4_ = x._4_4_ - (0x1c - iVar5);
    }
    uVar9 = this->pinfo[0].connected << 8 & this->pinfo[1].connected;
    if (((uVar9 != 0) &&
        (uVar9 = ((uVar9 & 0xfefefefefefefefe) >> 1 ^ 0xffffffffffffffff) & uVar9, uVar9 != 0)) &&
       (iVar5 = BitCount(uVar9), 2 < iVar5)) {
      x._4_4_ = (x._4_4_ * (10 - iVar5)) / 8;
    }
  }
  uVar10 = MajorsAndMinors<false>(this);
  uVar11 = MajorsAndMinors<true>(this);
  bVar2 = true;
  if ((((this->pc[2] == 0) && (bVar2 = true, this->pc[8] == 0)) &&
      ((bVar2 = true, this->pc[10] == 0 && (bVar2 = true, (this->pc[6] & this->pc[6] - 1) == 0))))
     && ((this->pc[4] == 0 || (bVar2 = true, this->pc[6] == 0)))) {
    iVar5 = BitCount(uVar10);
    bVar2 = 2 < iVar5;
  }
  local_82 = true;
  if (((((this->pc[3] == 0) && (local_82 = true, this->pc[9] == 0)) &&
       (local_82 = true, this->pc[0xb] == 0)) &&
      (local_82 = true, (this->pc[7] & this->pc[7] - 1) == 0)) &&
     ((this->pc[5] == 0 || (local_82 = true, this->pc[7] == 0)))) {
    iVar5 = BitCount(uVar11);
    local_82 = 2 < iVar5;
  }
  if ((!bVar2) && (local_82 == false)) {
    this->state = this->state | 0x20;
    CVar1 = ColorToMove(this);
    this->standPat = (&_drawScore)[CVar1];
    return;
  }
  if (((x._4_4_ < 1) || (bVar2 != false)) && ((-1 < x._4_4_ || (local_82 != false)))) {
    if ((this->pc[2] == 0) && (this->pc[3] == 0)) {
      if ((((uVar10 == 0) || (uVar10 != (uVar10 & -uVar10))) ||
          ((uVar11 == 0 || (uVar11 != (uVar11 & -uVar11))))) ||
         (((uVar10 != this->pc[10] || (uVar11 != this->pc[9])) &&
          ((uVar11 != this->pc[0xb] || (uVar10 != this->pc[8])))))) {
        if ((((uVar10 != 0) && (uVar10 == (uVar10 & -uVar10))) && (uVar10 == this->pc[8])) &&
           ((uVar12 = MinorPieces<true>(this), uVar11 == uVar12 &&
            (iVar5 = BitCount(uVar11), iVar5 < 3)))) {
          iVar5 = x._4_4_;
          if (x._4_4_ < 1) {
            iVar5 = -x._4_4_;
          }
          if (iVar5 < 0x100) {
            iVar5 = x._4_4_;
            if (x._4_4_ < 1) {
              iVar5 = -x._4_4_;
            }
            x._4_4_ = (x._4_4_ * iVar5) / 0x100;
            goto LAB_0010dad3;
          }
        }
        if (((uVar11 != 0) && (uVar11 == (uVar11 & -uVar11))) &&
           ((uVar11 == this->pc[9] &&
            ((uVar11 = MinorPieces<false>(this), uVar10 == uVar11 &&
             (iVar5 = BitCount(uVar10), iVar5 < 3)))))) {
          iVar5 = x._4_4_;
          if (x._4_4_ < 1) {
            iVar5 = -x._4_4_;
          }
          if (iVar5 < 0x100) {
            iVar5 = x._4_4_;
            if (x._4_4_ < 1) {
              iVar5 = -x._4_4_;
            }
            x._4_4_ = (x._4_4_ * iVar5) / 0x100;
          }
        }
      }
      else {
        iVar5 = -0x50;
        if (0 < x._4_4_) {
          iVar5 = 0x50;
        }
        x._4_4_ = x._4_4_ - iVar5;
      }
    }
    else {
      if ((uVar10 == this->pc[8]) && (uVar11 == this->pc[9])) {
        iVar5 = x._4_4_;
        if (x._4_4_ < 1) {
          iVar5 = -x._4_4_;
        }
        if (iVar5 < 0x80) {
          iVar5 = x._4_4_;
          if (x._4_4_ < 1) {
            iVar5 = -x._4_4_;
          }
          x._4_4_ = (x._4_4_ * iVar5) / 0x80;
          goto LAB_0010dad3;
        }
      }
      if ((((uVar10 == this->pc[6]) && (uVar11 == this->pc[7])) &&
          (((uVar10 & 0xaa55aa55aa55aa55) == 0) != ((uVar11 & 0xaa55aa55aa55aa55) == 0))) &&
         (((uVar10 != 0 && (uVar10 == (uVar10 & -uVar10))) &&
          ((uVar11 != 0 && (uVar11 == (uVar11 & -uVar11))))))) {
        iVar5 = x._4_4_;
        if (x._4_4_ < 1) {
          iVar5 = -x._4_4_;
        }
        if (iVar5 < 300) {
          if (x._4_4_ < 1) {
            uVar10 = this->pinfo[1].connected;
          }
          else {
            uVar10 = this->pinfo[0].connected;
          }
          if (uVar10 == 0) {
            x._4_4_ = x._4_4_ / 3;
          }
          iVar5 = x._4_4_;
          if (x._4_4_ < 1) {
            iVar5 = -x._4_4_;
          }
          x._4_4_ = (x._4_4_ * iVar5) / 300;
        }
      }
    }
  }
  else {
    if (bVar2 == local_82) {
      __assert_fail("whiteCanWin != blackCanWin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x786,"void bitfoot::Bitfoot::Evaluate()");
    }
    iVar5 = x._4_4_;
    if (x._4_4_ < 1) {
      iVar5 = -x._4_4_;
    }
    if (999 < iVar5) {
      __assert_fail("abs(eval) < 1000",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x787,"void bitfoot::Bitfoot::Evaluate()");
    }
    iVar5 = x._4_4_;
    if (x._4_4_ < 1) {
      iVar5 = -x._4_4_;
    }
    iVar6 = -0x32;
    if (bVar2 != false) {
      iVar6 = 0x32;
    }
    x._4_4_ = iVar6 + (x._4_4_ * iVar5) / 1000;
  }
LAB_0010dad3:
  if (0x19 < this->rcount) {
    iVar5 = x._4_4_;
    if (x._4_4_ < 1) {
      iVar5 = -x._4_4_;
    }
    if (8 < iVar5) {
      x._4_4_ = (int)((double)x._4_4_ * (25.0 / (double)this->rcount));
    }
  }
  CVar1 = ColorToMove(this);
  if (CVar1) {
    local_9c = -x._4_4_;
  }
  else {
    local_9c = x._4_4_;
  }
  this->standPat = local_9c;
  return;
}

Assistant:

void Evaluate() {
#ifndef NDEBUG
    assert(!(state & Draw));
    memset(&evals, 0, sizeof(evals));
#endif
    memset(pinfo, 0, sizeof(pinfo));
    memset(atks, 0, sizeof(atks));
    atkCount[White] = 0;
    atkCount[Black] = 0;
    atkScore[White] = 0;
    atkScore[Black] = 0;

    // evaluate from white's perspective
    int eval = ((ColorToMove() ? -_tempo : _tempo) +
                material[White] -
                material[Black] +
                sqrVal[White] -
                sqrVal[Black] +
                GetPins<Black>(6) -
                GetPins<White>(6));

    // no pawns = bad
    if (pc[WhitePawn])   eval += PawnEval<White>(); else eval -= 50;
    if (pc[BlackPawn])   eval -= PawnEval<Black>(); else eval += 50;
    if (pc[WhiteKnight]) eval += KnightEval<White>();
    if (pc[BlackKnight]) eval -= KnightEval<Black>();
    if (pc[WhiteBishop]) eval += BishopEval<White>();
    if (pc[BlackBishop]) eval -= BishopEval<Black>();
    if (pc[WhiteRook])   eval += RookEval<White>();
    if (pc[BlackRook])   eval -= RookEval<Black>();
    if (pc[WhiteQueen])  eval += QueenEval<White>();
    if (pc[BlackQueen])  eval -= QueenEval<Black>();

    // fill in attack bitmaps sans king attacks
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]);

    eval += KingEval<White>();
    eval -= KingEval<Black>();

    // finish populating attack bitmaps
    atks[WhiteKing] = _KING_ATK[king[White]];
    atks[BlackKing] = _KING_ATK[king[Black]];
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]  | atks[WhiteKing]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]  | atks[BlackKing]);

    // now that attack bitmaps are complete evaluate passed pawns
    if (pinfo[White].passed) eval += PasserEval<White>();
    if (pinfo[Black].passed) eval -= PasserEval<Black>();

#ifndef NDEBUG
    VerifyPosition();
#endif

    // NOTE: if draw due to rcount this destabilizes the transposition table
    //       because rcount is not encoded into positionKey
    if (IsDraw()) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // TODO use specialized eval function for particular piece configurations

    // bonus for board coverage
    uint64_t x;
    x = (atks[WhitePawn]|atks[WhiteKnight]|atks[WhiteBishop]|atks[WhiteRook]|
         (atks[WhiteQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval += (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));
    x = (atks[BlackPawn]|atks[BlackKnight]|atks[BlackBishop]|atks[BlackRook]|
         (atks[BlackQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval -= (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));

    // penalty for unprotected pawns, knights, and bishops
    if ((x = ((pc[WhitePawn]|MinorPieces<White>()) & ~atks[White]))) {
      eval -= (6 * BitCount(x));
    }
    if ((x = ((pc[BlackPawn]|MinorPieces<Black>()) & ~atks[Black]))) {
      eval += (6 * BitCount(x));
    }

    // redundant knights are worth slightly less
    if (MULTI_BIT(pc[WhiteKnight])) {
      eval -= (16 * (BitCount(pc[WhiteKnight]) - 1));
    }
    if (MULTI_BIT(pc[BlackKnight])) {
      eval += (16 * (BitCount(pc[BlackKnight]) - 1));
    }

    // are there any pawns on the board?
    if (pc[WhitePawn] || pc[BlackPawn]) {
      assert(pinfo[White].count == BitCount(pc[WhitePawn]));
      assert(pinfo[Black].count == BitCount(pc[BlackPawn]));

      // bonus for uncontested contiguous vertical space behind connected pawns
      x = (pinfo[White].behind & ~atks[Black]);
      x &= (x >> 8);
      eval += (2 * BitCount(x));
      x = (pinfo[Black].behind & ~atks[White]);
      x &= (x >> 8);
      eval -= (2 * BitCount(x));

      // increase value of 1 knight relative to # of pawns on the board
      int count = ((4 * (pinfo[White].count + pinfo[Black].count)) / 3);
      assert(count <= 21);
      if (pc[WhiteKnight]) {
        eval += count;
      }
      if (pc[BlackKnight]) {
        eval -= count;
      }

      // increase value of 1 rook as pawns come off the board
      count = ((4 * count) / 3); // inflate pawn count a bit more
      assert(count <= 28);
      if (pc[WhiteRook]) {
        eval += (28 - count);
      }
      if (pc[BlackRook]) {
        eval -= (28 - count);
      }

      // reduce winning score relative to number of locked pawns
      if ((x = ((pinfo[White].connected << North) & pinfo[Black].connected))) {
        if ((x &= ~((x & ~_FILE[0]) >> 1))) {
          if ((count = BitCount(x)) > 2) {
            eval = ((eval * (10 - count)) / 8);
          }
        }
      }
    }

    // draw due to lack of mating material?
    const uint64_t whitePcs = MajorsAndMinors<White>();
    const uint64_t blackPcs = MajorsAndMinors<Black>();
    const bool whiteCanWin  = (pc[WhitePawn] || pc[WhiteRook] ||
                               pc[WhiteQueen] || MULTI_BIT(pc[WhiteBishop]) ||
                               (pc[WhiteKnight] && pc[WhiteBishop]) ||
                               (BitCount(whitePcs) > 2));
    const bool blackCanWin  = (pc[BlackPawn] || pc[BlackRook] ||
                               pc[BlackQueen] || MULTI_BIT(pc[BlackBishop]) ||
                               (pc[BlackKnight] && pc[BlackBishop]) ||
                               (BitCount(blackPcs) > 2));
    if (!whiteCanWin && !blackCanWin) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // reduce winning score if "winning" side can't win
    if (((eval > 0) && !whiteCanWin) || ((eval < 0) && !blackCanWin)) {
      assert(whiteCanWin != blackCanWin);
      assert(abs(eval) < 1000);
      eval = ((eval * abs(eval)) / 1000);
      eval += (whiteCanWin ? 50 : -50);
    }

    else if (!pc[WhitePawn] && !pc[BlackPawn]) {
      // reduce winning score if Q vs R
      if (SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
          (((whitePcs == pc[WhiteQueen]) && (blackPcs == pc[BlackRook])) ||
           ((blackPcs == pc[BlackQueen]) && (whitePcs == pc[WhiteRook]))))
      {
        eval -= ((eval > 0) ? 80 : -80);
      }

      // reduce winning score if R vs minor(s)
      else if (SINGLE_BIT(whitePcs) && (whitePcs == pc[WhiteRook]) &&
               (blackPcs == MinorPieces<Black>()) &&
               (BitCount(blackPcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
      else if (SINGLE_BIT(blackPcs) && (blackPcs == pc[BlackRook]) &&
               (whitePcs == MinorPieces<White>()) &&
               (BitCount(whitePcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
    }

    // reduce winning score if pawns + R vs R ending
    else if ((whitePcs == pc[WhiteRook]) && (blackPcs == pc[BlackRook]) &&
             (abs(eval) < 128))
    {
      eval = ((eval * abs(eval)) / 128);
    }

    // reduce winning score if pawns + opposite color bishop ending
    else if ((whitePcs == pc[WhiteBishop]) && (blackPcs == pc[BlackBishop]) &&
             (!(whitePcs & _LIGHT) != !(blackPcs & _LIGHT)) &&
             SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
             (abs(eval) < 300))
    {
      if ((eval > 0) ? !pinfo[White].connected : !pinfo[Black].connected) {
        eval /= 3;
      }
      eval = ((eval * abs(eval)) / 300);
    }

    // reduce winning score if rcount is getting large
    // NOTE: this destabilizes transposition table values
    //       because rcount is not encoded into positionKey
    if ((rcount > 25) && (abs(eval) > 8)) {
      eval = static_cast<int>(eval * (25.0 / rcount));
    }

    // standPat is eval from persepctive of the side to move
    standPat = (ColorToMove() ? -eval : eval);
  }